

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O0

void soplex::updateRes<double>
               (SVSetBase<double> *facset,SSVectorBase<double> *resvecprev,
               SSVectorBase<double> *resvec,SSVectorBase<double> *tmpvec,double eprev,double qcurr,
               double epsilon)

{
  bool bVar1;
  SSVectorBase<double> *in_RCX;
  SVSetBase<double> *in_RDX;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  Timer *in_XMM0_Qa;
  SSVectorBase<double> *in_XMM1_Qa;
  SSVectorBase<double> *in_XMM2_Qa;
  int *unaff_retaddr;
  int dummy2;
  int dummy1;
  double in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  undefined4 uVar3;
  
  bVar1 = isZero<double,double>((double)in_RDI,in_stack_ffffffffffffffa8);
  if (bVar1) {
    SSVectorBase<double>::clear(in_RDI);
  }
  else {
    SSVectorBase<double>::operator*=(in_XMM1_Qa,(double)in_XMM2_Qa);
  }
  uVar3 = 0;
  uVar2 = 0;
  SSVectorBase<double>::assign2product4setup<double,double>
            (in_RSI,in_RDX,in_RCX,in_XMM0_Qa,(Timer *)in_XMM1_Qa,(int *)in_XMM2_Qa,unaff_retaddr);
  SSVectorBase<double>::setup((SSVectorBase<double> *)CONCAT44(uVar3,uVar2));
  SSVectorBase<double>::operator+=(in_XMM1_Qa,in_XMM2_Qa);
  SSVectorBase<double>::operator*=(in_XMM1_Qa,(double)in_XMM2_Qa);
  SSVectorBase<double>::setup((SSVectorBase<double> *)CONCAT44(uVar3,uVar2));
  return;
}

Assistant:

static inline void updateRes(
   const SVSetBase<R> facset,
   const SSVectorBase<R> resvecprev,
   SSVectorBase<R>& resvec,
   SSVectorBase<R>& tmpvec,
   R eprev,
   R qcurr,
   R epsilon)
{
   assert(qcurr != 0.0);

   if(isZero(eprev, epsilon))
      resvec.clear();
   else
      resvec *= eprev;

   int dummy1 = 0;
   int dummy2 = 0;
   tmpvec.assign2product4setup(facset, resvecprev, nullptr, nullptr, dummy1, dummy2);
   tmpvec.setup();
   resvec += tmpvec;

   resvec *= (-1.0 / qcurr);
   resvec.setup();
}